

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O3

Am_Wrapper * get_button_widget_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object widget;
  Am_Value value;
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    local_18.type = 0;
    local_18.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(&local_20,0x169,1);
    Am_Value::operator=(&local_18,in_value);
    bVar1 = Am_Value::Valid(&local_18);
    if (bVar1) {
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_20);
      Am_Value::~Am_Value(&local_18);
      goto LAB_00262677;
    }
    Am_Value::~Am_Value(&local_18);
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
LAB_00262677:
  Am_Object::~Am_Object(&local_20);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(get_button_widget_value)
{
  Am_Object widget = self.Get_Owner(); // widget the interactor is in
  if (widget.Valid()) {
    Am_Value value;
    value = widget.Peek(Am_VALUE);
    if (value.Valid())
      return widget;
  }
  return Am_No_Object;
}